

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O0

int Abc_NtkRetimeMinArea
              (Abc_Ntk_t *pNtk,int fForwardOnly,int fBackwardOnly,int fUseOldNames,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vValues_00;
  Abc_Ntk_t *pAVar4;
  Vec_Int_t *vValues_01;
  int fOneFrame;
  int nLatches;
  Vec_Int_t *vValues;
  Vec_Int_t *vValuesNew;
  Abc_Ntk_t *pNtkBottom;
  Abc_Ntk_t *pNtkTotal;
  int fVerbose_local;
  int fUseOldNames_local;
  int fBackwardOnly_local;
  int fForwardOnly_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtkBottom = (Abc_Ntk_t *)0x0;
  iVar1 = Abc_NtkLatchNum(pNtk);
  if ((fForwardOnly != 0) && (fBackwardOnly != 0)) {
    __assert_fail("!fForwardOnly || !fBackwardOnly",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retArea.c"
                  ,0x3b,"int Abc_NtkRetimeMinArea(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar2 = Abc_NtkIsSopLogic(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retArea.c"
                  ,0x3d,"int Abc_NtkRetimeMinArea(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar2 = Abc_NtkLatchNum(pNtk);
  iVar3 = Vec_PtrSize(pNtk->vBoxes);
  if (iVar2 == iVar3) {
    Abc_NtkOrderCisCos(pNtk);
    if (fBackwardOnly == 0) {
      do {
        pAVar4 = Abc_NtkRetimeMinAreaOne(pNtk,1,fUseOldNames,fVerbose);
      } while (pAVar4 != (Abc_Ntk_t *)0x0);
    }
    vValues_00 = Abc_NtkCollectLatchValues(pNtk);
    if (fForwardOnly == 0) {
      while (pAVar4 = Abc_NtkRetimeMinAreaOne(pNtk,0,fUseOldNames,fVerbose),
            pAVar4 != (Abc_Ntk_t *)0x0) {
        pNtkBottom = Abc_NtkAttachBottom(pNtkBottom,pAVar4);
      }
    }
    vValues_01 = Abc_NtkRetimeInitialValues(pNtkBottom,vValues_00,fVerbose);
    if (pNtkBottom != (Abc_Ntk_t *)0x0) {
      Abc_NtkDelete(pNtkBottom);
    }
    Abc_NtkInsertLatchValues(pNtk,vValues_01);
    if (vValues_01 != (Vec_Int_t *)0x0) {
      Vec_IntFree(vValues_01);
    }
    if (vValues_00 != (Vec_Int_t *)0x0) {
      Vec_IntFree(vValues_00);
    }
    iVar2 = Abc_NtkCheck(pNtk);
    if (iVar2 == 0) {
      fprintf(_stdout,"Abc_NtkRetimeMinArea(): Network check has failed.\n");
    }
    iVar2 = Abc_NtkLatchNum(pNtk);
    return iVar1 - iVar2;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == Vec_PtrSize(pNtk->vBoxes)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retArea.c"
                ,0x3e,"int Abc_NtkRetimeMinArea(Abc_Ntk_t *, int, int, int, int)");
}

Assistant:

int Abc_NtkRetimeMinArea( Abc_Ntk_t * pNtk, int fForwardOnly, int fBackwardOnly, int fUseOldNames, int fVerbose )
{
    Abc_Ntk_t * pNtkTotal = NULL, * pNtkBottom;
    Vec_Int_t * vValuesNew = NULL, * vValues;
    int nLatches = Abc_NtkLatchNum(pNtk);
    int fOneFrame = 0;
    assert( !fForwardOnly || !fBackwardOnly );
    // there should not be black boxes
    assert( Abc_NtkIsSopLogic(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == Vec_PtrSize(pNtk->vBoxes) );
    // reorder CI/CO/latch inputs
    Abc_NtkOrderCisCos( pNtk );
    // perform forward retiming
    if ( !fBackwardOnly )
    {
        if ( fOneFrame )
            Abc_NtkRetimeMinAreaOne( pNtk, 1, fUseOldNames, fVerbose );
        else
            while ( Abc_NtkRetimeMinAreaOne( pNtk, 1, fUseOldNames, fVerbose ) );
    }
    // remember initial values
    vValues = Abc_NtkCollectLatchValues( pNtk );
    // perform backward retiming
    if ( !fForwardOnly )
    {
        if ( fOneFrame )
            pNtkTotal = Abc_NtkRetimeMinAreaOne( pNtk, 0, fUseOldNames, fVerbose );
        else
            while ( (pNtkBottom = Abc_NtkRetimeMinAreaOne( pNtk, 0, fUseOldNames, fVerbose )) )
                pNtkTotal = Abc_NtkAttachBottom( pNtkTotal, pNtkBottom );  
    }
    // compute initial values
    vValuesNew = Abc_NtkRetimeInitialValues( pNtkTotal, vValues, fVerbose );
    if ( pNtkTotal ) Abc_NtkDelete( pNtkTotal );
    // insert new initial values
    Abc_NtkInsertLatchValues( pNtk, vValuesNew );
    if ( vValuesNew ) Vec_IntFree( vValuesNew );
    if ( vValues )    Vec_IntFree( vValues );
    // fix the COs (this changes the circuit structure)
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeMinArea(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}